

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O0

knetFile * knet_open(char *fn,char *mode)

{
  int iVar1;
  char *pcVar2;
  knetFile *pkStack_28;
  int fd;
  knetFile *fp;
  char *mode_local;
  char *fn_local;
  
  if (*mode != 'r') {
    fprintf(_stderr,"[kftp_open] only mode \"r\" is supported.\n");
    return (knetFile *)0x0;
  }
  pcVar2 = strstr(fn,"ftp://");
  if (pcVar2 == fn) {
    pkStack_28 = kftp_parse_url(fn,mode);
    if (pkStack_28 == (knetFile *)0x0) {
      return (knetFile *)0x0;
    }
    iVar1 = kftp_connect(pkStack_28);
    if (iVar1 == -1) {
      knet_close(pkStack_28);
      return (knetFile *)0x0;
    }
    kftp_connect_file(pkStack_28);
  }
  else {
    pcVar2 = strstr(fn,"http://");
    if (pcVar2 == fn) {
      pkStack_28 = khttp_parse_url(fn,mode);
      if (pkStack_28 == (knetFile *)0x0) {
        return (knetFile *)0x0;
      }
      khttp_connect_file(pkStack_28);
    }
    else {
      iVar1 = open(fn,0);
      if (iVar1 == -1) {
        perror("open");
        return (knetFile *)0x0;
      }
      pkStack_28 = (knetFile *)calloc(1,0x80);
      pkStack_28->type = 1;
      pkStack_28->fd = iVar1;
      pkStack_28->ctrl_fd = -1;
    }
  }
  if ((pkStack_28 == (knetFile *)0x0) || (pkStack_28->fd != -1)) {
    fn_local = (char *)pkStack_28;
  }
  else {
    knet_close(pkStack_28);
    fn_local = (char *)0x0;
  }
  return (knetFile *)fn_local;
}

Assistant:

knetFile *knet_open(const char *fn, const char *mode)
{
	knetFile *fp = 0;
	if (mode[0] != 'r') {
		fprintf(stderr, "[kftp_open] only mode \"r\" is supported.\n");
		return 0;
	}
	if (strstr(fn, "ftp://") == fn) {
		fp = kftp_parse_url(fn, mode);
		if (fp == 0) return 0;
		if (kftp_connect(fp) == -1) {
			knet_close(fp);
			return 0;
		}
		kftp_connect_file(fp);
	} else if (strstr(fn, "http://") == fn) {
		fp = khttp_parse_url(fn, mode);
		if (fp == 0) return 0;
		khttp_connect_file(fp);
	} else { // local file
#ifdef _WIN32
		/* In windows, O_BINARY is necessary. In Linux/Mac, O_BINARY may
		 * be undefined on some systems, although it is defined on my
		 * Mac and the Linux I have tested on. */
		int fd = open(fn, O_RDONLY | O_BINARY);
#else		
		int fd = open(fn, O_RDONLY);
#endif
		if (fd == -1) {
			perror("open");
			return 0;
		}
		fp = (knetFile*)calloc(1, sizeof(knetFile));
		fp->type = KNF_TYPE_LOCAL;
		fp->fd = fd;
		fp->ctrl_fd = -1;
	}
	if (fp && fp->fd == -1) {
		knet_close(fp);
		return 0;
	}
	return fp;
}